

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRule.h
# Opt level: O0

void __thiscall GdlRule::GdlRule(GdlRule *this)

{
  long in_RDI;
  GdlObject *in_stack_00000060;
  
  GdlObject::GdlObject(in_stack_00000060);
  std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::vector
            ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)0x27d7a6);
  std::vector<GdlExpression_*,_std::allocator<GdlExpression_*>_>::vector
            ((vector<GdlExpression_*,_std::allocator<GdlExpression_*>_> *)0x27d7b4);
  std::vector<GdlAlias_*,_std::allocator<GdlAlias_*>_>::vector
            ((vector<GdlAlias_*,_std::allocator<GdlAlias_*>_> *)0x27d7c2);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x27d7d0);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x27d7e1);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x27d7f2);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x27d803);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x27d814);
  *(undefined4 *)(in_RDI + 0x28) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x11c) = 0xffffffff;
  *(undefined1 *)(in_RDI + 0x120) = 0;
  *(undefined1 *)(in_RDI + 0x121) = 0;
  return;
}

Assistant:

GdlRule()
	{
		m_nScanAdvance = -1;
		m_nDefaultAdvance = -1;
		m_fBadRule = false;
		m_fAutoAssoc = false;
	}